

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.hpp
# Opt level: O3

IMove __thiscall
generic_bots::
FixedMctsBot<uttt::IBoard,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_(*)(const_uttt::IBoard_&,_long_long)>
::MakeMove(FixedMctsBot<uttt::IBoard,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_(*)(const_uttt::IBoard_&,_long_long)>
           *this)

{
  IMove IVar1;
  MCTSResults *result;
  pointer pMVar2;
  double dVar3;
  double dVar4;
  IMove move;
  vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> results;
  IMove local_30;
  vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> local_28;
  
  (*this->mcts)(&local_28,(this->super_IBot<uttt::IBoard>).game,this->num_iterations);
  local_30 = -1;
  if (local_28.super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_28.super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    dVar3 = -1.1;
    pMVar2 = local_28.super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      dVar4 = pMVar2->value / (double)pMVar2->total;
      if (dVar3 < dVar4) {
        local_30 = pMVar2->move;
        dVar3 = dVar4;
      }
      pMVar2 = pMVar2 + 1;
    } while (pMVar2 != local_28.
                       super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  uttt::IBoard::ApplyMove((this->super_IBot<uttt::IBoard>).game,&local_30);
  IVar1 = local_30;
  if (local_28.super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return IVar1;
}

Assistant:

game::IMove
FixedMctsBot<IGame, MCTS>::MakeMove()
{
    auto results = mcts(*this->game, num_iterations);

    double max = -1.1;
    game::IMove move = -1;
    for (const auto &result : results)
    {
        auto v = result.value / result.total;
        if (v > max)
            max = v, move = result.move;
    }

    this->game->ApplyMove(move);

    return move;
}